

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O3

void __thiscall features::Surf::filter_dx_dy(Surf *this,int x,int y,int fs,float *dx,float *dy)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  int iVar5;
  element_type *peVar6;
  pointer plVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  pointer plVar17;
  int iVar18;
  long *plVar19;
  float fVar20;
  
  peVar6 = (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = (peVar6->super_TypedImageBase<long>).super_ImageBase.w;
  plVar7 = (peVar6->super_TypedImageBase<long>).data.super__Vector_base<long,_std::allocator<long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  plVar17 = (pointer)0x0;
  if (plVar7 != *(pointer *)
                 ((long)&(peVar6->super_TypedImageBase<long>).data.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data + 8)) {
    plVar17 = plVar7;
  }
  iVar16 = x + ~fs;
  lVar8 = plVar17[(long)iVar16 + (long)((~fs + y) * iVar5)];
  plVar1 = plVar17 + (long)iVar16 + (long)((~fs + y) * iVar5) + fs;
  iVar18 = fs * 2 + 1;
  plVar2 = plVar17 + (long)iVar16 + (long)((y + -1) * iVar5);
  plVar3 = plVar2 + iVar18;
  lVar9 = *plVar3;
  lVar10 = (plVar3 + (~(fs * 2) + iVar5))[iVar18];
  plVar19 = plVar1 + (long)fs + 1;
  lVar11 = *plVar19;
  fVar20 = (float)(iVar18 * (fs + 1) * fs);
  plVar4 = plVar19 + (iVar5 + -1) * iVar18 + fs;
  lVar12 = plVar4[(long)fs + 1];
  lVar13 = plVar19[(iVar5 + -1) * iVar18];
  lVar14 = *plVar2;
  lVar15 = plVar3[~(fs * 2) + iVar5];
  *dx = (float)(((*plVar1 + plVar1[1] + lVar13) - (lVar8 + lVar11 + *plVar4 + plVar4[1])) + lVar12)
        / fVar20;
  *dy = (float)(((lVar11 - (lVar8 + lVar13)) + lVar12 + lVar14 + lVar15) - (lVar9 + lVar10)) /
        fVar20;
  return;
}

Assistant:

void
Surf::filter_dx_dy (int x, int y, int fs, float* dx, float* dy)
{
    int const width = this->sat->width();
    SatType const* ptr = this->sat->begin();

    /*
     * To have a center pixel, filter size needs to be odd.
     * To ensure symmetry in the filters, we include the center row in
     * both sides of the dy filter, and the center column in both sides
     * of the dx filter, which cancels them out. However, this costs
     * four additional lookups (12 instead of 8).
     */
    SatType const* iter = ptr + (x - fs - 1) + (y - fs - 1) * width;
    SatType x1 = *iter; iter += fs;
    SatType x2 = *iter; iter += 1;
    SatType x3 = *iter; iter += fs;
    SatType x4 = *iter; iter += (width - 1) * (2 * fs + 1);

    SatType x5 = *iter; iter += fs;
    SatType x6 = *iter; iter += 1;
    SatType x7 = *iter; iter += fs;
    SatType x8 = *iter;

    iter = ptr + (x - fs - 1) + (y - 1) * width;
    SatType y1 = *iter; iter += 2 * fs + 1;
    SatType y2 = *iter; iter += width - 2 * fs - 1;
    SatType y3 = *iter; iter += 2 * fs + 1;
    SatType y4 = *iter;

    /*
     * Normalize filter by size "(2 * fs + 1) * fs" and normalize discrete
     * derivative with distance between the Wavelet box centers "fs + 1".
     */
    float norm = static_cast<float>((2 * fs + 1) * fs * (fs + 1));
    *dx = static_cast<float>((x8 + x2 - x4 - x6) - (x7 + x1 - x3 - x5)) / norm;
    *dy = static_cast<float>((x8 + y1 - x5 - y2) - (y4 + x1 - y3 - x4)) / norm;
}